

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::MixedAssignmentVisitor::check_var_parent
               (Generator *generator,Var *dst_var,Var *var,Stmt *stmt)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  bool bVar1;
  int iVar2;
  VarType VVar3;
  PortDirection PVar4;
  int iVar5;
  undefined4 extraout_var;
  Generator *pGVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  VarException *pVVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar10;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_stack_fffffffffffffc18;
  Port *local_378;
  Port *local_368;
  allocator<const_kratos::IRNode_*> local_349;
  Var *local_348;
  VarSlice *local_340;
  Var *local_338;
  Stmt *local_330;
  Generator *local_328;
  Var **local_320;
  size_type local_318;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_310;
  undefined1 local_2f8 [32];
  remove_reference_t<std::__cxx11::basic_string<char>_&> local_2d8;
  string local_2b8;
  undefined1 local_292;
  allocator<const_kratos::IRNode_*> local_291;
  Var *local_290;
  VarSlice *local_288;
  Var *local_280;
  Stmt *local_278;
  Var **local_270;
  size_type local_268;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_260;
  undefined1 local_248 [48];
  remove_reference_t<std::__cxx11::basic_string<char>_&> local_218;
  string local_1f8;
  VarSlice *local_1d8;
  IRNode *context_g;
  Port *port;
  VarSlice *slice;
  Generator *gen;
  Stmt *stmt_local;
  Var *var_local;
  Var *dst_var_local;
  Generator *generator_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_190;
  basic_string_view<char> local_188;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_130;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  uint32_t *local_120;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_118;
  uint32_t *local_110;
  char *local_108;
  string *local_100;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_f8;
  basic_string_view<char> local_e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  uint32_t *local_80;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_78;
  uint32_t *local_70;
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  gen = (Generator *)stmt;
  stmt_local = (Stmt *)var;
  var_local = dst_var;
  dst_var_local = (Var *)generator;
  iVar2 = (*(var->super_IRNode)._vptr_IRNode[0xd])();
  slice = (VarSlice *)CONCAT44(extraout_var,iVar2);
  pGVar6 = Const::const_gen();
  if ((Generator *)CONCAT44(extraout_var,iVar2) != pGVar6) {
    VVar3 = Var::type((Var *)stmt_local);
    if ((VVar3 == ConstValue) &&
       (iVar2 = (*(stmt_local->super_IRNode)._vptr_IRNode[0xd])(),
       (Var *)CONCAT44(extraout_var_00,iVar2) != dst_var_local)) {
      Var::set_generator((Var *)stmt_local,(Generator *)slice);
      return;
    }
    if ((VarSlice *)dst_var_local == slice) {
      return;
    }
    VVar3 = Var::type(var_local);
    if (VVar3 == Slice) {
      if (var_local == (Var *)0x0) {
        local_368 = (Port *)0x0;
      }
      else {
        local_368 = (Port *)__dynamic_cast(var_local,&Var::typeinfo,&VarSlice::typeinfo,0);
      }
      port = local_368;
      iVar2 = (*(local_368->super_Var).super_IRNode._vptr_IRNode[0x29])();
      var_local = (Var *)CONCAT44(extraout_var_01,iVar2);
    }
    VVar3 = Var::type(var_local);
    if (VVar3 == PortIO) {
      if (var_local == (Var *)0x0) {
        local_378 = (Port *)0x0;
      }
      else {
        local_378 = (Port *)__dynamic_cast(var_local,&Var::typeinfo,&Port::typeinfo,0);
      }
      context_g = (IRNode *)local_378;
      PVar4 = Port::port_direction(local_378);
      if (PVar4 == In) {
        iVar2 = (*(var_local->super_IRNode)._vptr_IRNode[0xd])();
        local_1d8 = (VarSlice *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x20))();
        if (slice == local_1d8) {
          return;
        }
        iVar2 = (*(slice->super_Var).super_IRNode._vptr_IRNode[4])();
        if ((VarSlice *)CONCAT44(extraout_var_03,iVar2) == local_1d8) {
          return;
        }
        iVar2 = (*(slice->super_Var).super_IRNode._vptr_IRNode[4])();
        if ((VarSlice *)CONCAT44(extraout_var_04,iVar2) == local_1d8) {
          return;
        }
        local_292 = 1;
        pVVar7 = (VarException *)__cxa_allocate_exception(0x10);
        puVar8 = &dst_var_local->var_width_;
        (*(var_local->super_IRNode)._vptr_IRNode[0x1f])(&local_218);
        puVar9 = &(slice->super_Var).var_width_;
        (*(stmt_local->super_IRNode)._vptr_IRNode[0x1f])(local_248);
        local_60 = &local_1f8;
        local_68 = "{0}.{1} cannot be wired to {2}.{3} because {0} is not a child generator of {2}";
        local_78 = &local_218;
        aVar10.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             local_248;
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)aVar10.values_;
        local_80 = puVar9;
        local_70 = puVar8;
        fmt::v7::
        make_args_checked<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string,char[79],char>
                  (&local_d8,
                   (v7 *)
                   "{0}.{1} cannot be wired to {2}.{3} because {0} is not a child generator of {2}",
                   (char (*) [79])puVar8,local_78,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)puVar9,
                   (remove_reference_t<std::__cxx11::basic_string<char>_&> *)aVar10.values_,
                   in_stack_fffffffffffffc18);
        local_90 = &local_d8;
        local_e8 = fmt::v7::to_string_view<char,_0>(local_68);
        local_50 = &local_f8;
        local_58 = local_90;
        local_20 = local_90;
        local_10 = local_90;
        local_18 = local_50;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_50,0xdddd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_90);
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = aVar10.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_f8.field_1.values_;
        format_str.size_ = local_f8.desc_;
        format_str.data_ = (char *)local_e8.size_;
        fmt::v7::detail::vformat_abi_cxx11_(&local_1f8,(detail *)local_e8.data_,format_str,args);
        local_290 = dst_var_local;
        local_288 = slice;
        local_280 = var_local;
        local_278 = stmt_local;
        local_270 = &local_290;
        local_268 = 4;
        std::allocator<const_kratos::IRNode_*>::allocator(&local_291);
        __l_00._M_len = local_268;
        __l_00._M_array = (iterator)local_270;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_260,__l_00,&local_291);
        VarException::VarException(pVVar7,&local_1f8,&local_260);
        local_292 = 0;
        __cxa_throw(pVVar7,&VarException::typeinfo,VarException::~VarException);
      }
    }
    iVar2 = (*(slice->super_Var).super_IRNode._vptr_IRNode[4])();
    if ((Var *)CONCAT44(extraout_var_05,iVar2) != dst_var_local) {
      iVar2 = (*(slice->super_Var).super_IRNode._vptr_IRNode[4])();
      iVar5 = (*(dst_var_local->super_IRNode)._vptr_IRNode[4])();
      if (CONCAT44(extraout_var_06,iVar2) != CONCAT44(extraout_var_07,iVar5)) goto LAB_003d043c;
    }
    bVar1 = has_non_port((Generator *)dst_var_local,(Var *)stmt_local);
    if (bVar1) {
LAB_003d043c:
      pVVar7 = (VarException *)__cxa_allocate_exception(0x10);
      puVar8 = &dst_var_local->var_width_;
      (*(var_local->super_IRNode)._vptr_IRNode[0x1f])(&local_2d8);
      puVar9 = &(slice->super_Var).var_width_;
      (*(stmt_local->super_IRNode)._vptr_IRNode[0x1f])(local_2f8);
      local_100 = &local_2b8;
      local_108 = "{0}.{1} cannot be wired to {2}.{3} because {2} is not a child generator of {0}";
      local_118 = &local_2d8;
      aVar10.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           local_2f8;
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)aVar10.values_;
      local_120 = puVar9;
      local_110 = puVar8;
      fmt::v7::
      make_args_checked<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string,char[79],char>
                (&local_178,
                 (v7 *)
                 "{0}.{1} cannot be wired to {2}.{3} because {2} is not a child generator of {0}",
                 (char (*) [79])puVar8,local_118,
                 (remove_reference_t<std::__cxx11::basic_string<char>_> *)puVar9,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)aVar10.values_,
                 in_stack_fffffffffffffc18);
      local_130 = &local_178;
      local_188 = fmt::v7::to_string_view<char,_0>(local_108);
      local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&generator_local;
      local_48 = local_130;
      local_38 = local_130;
      local_28 = local_130;
      local_30 = local_40;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_40,0xdddd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_130);
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar10.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_190.values_;
      format_str_00.size_ = (size_t)generator_local;
      format_str_00.data_ = (char *)local_188.size_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_2b8,(detail *)local_188.data_,format_str_00,args_00);
      local_348 = dst_var_local;
      local_340 = slice;
      local_338 = var_local;
      local_330 = stmt_local;
      local_328 = gen;
      local_320 = &local_348;
      local_318 = 5;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_349);
      __l._M_len = local_318;
      __l._M_array = (iterator)local_320;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_310,__l,&local_349);
      VarException::VarException(pVVar7,&local_2b8,&local_310);
      __cxa_throw(pVVar7,&VarException::typeinfo,VarException::~VarException);
    }
  }
  return;
}

Assistant:

static void check_var_parent(Generator* generator, Var* dst_var, Var* var, Stmt* stmt) {
        auto* gen = var->generator();
        if (gen == Const::const_gen()) return;
        if (var->type() == VarType::ConstValue && var->generator() != generator) {
            var->set_generator(gen);
            return;
        }
        if (generator != gen) {
            // if it's an input port, the parent context is different
            if (dst_var->type() == VarType::Slice) {
                auto* slice = dynamic_cast<VarSlice*>(dst_var);
                dst_var = const_cast<Var*>(slice->get_var_root_parent());
            }
            if (dst_var->type() == VarType::PortIO) {
                auto* port = dynamic_cast<Port*>(dst_var);
                if (port->port_direction() == PortDirection::In) {
                    auto* context_g = dst_var->generator()->parent();
                    if (gen != context_g && gen->parent() != context_g &&
                        gen->parent() != context_g) {
                        throw VarException(
                            ::format("{0}.{1} cannot be wired to {2}.{3} because {0} is "
                                     "not a child generator of {2}",
                                     generator->instance_name, dst_var->to_string(),
                                     gen->instance_name, var->to_string()),
                            {generator, gen, dst_var, var});
                    }
                    return;
                }
            }
            if ((gen->parent() != generator && gen->parent() != generator->parent()) ||
                has_non_port(generator, var)) {
                throw VarException(::format("{0}.{1} cannot be wired to {2}.{3} because {2} is "
                                            "not a child generator of {0}",
                                            generator->instance_name, dst_var->to_string(),
                                            gen->instance_name, var->to_string()),
                                   {generator, gen, dst_var, var, stmt});
            }
        }
    }